

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  
  uVar1 = (((((((fadexpr->fadexpr_).left_)->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar1;
      uVar7 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar7 = (long)(int)uVar1 << 3;
      }
      pdVar6 = (double *)operator_new__(uVar7);
      (this->dx_).ptr_to_data = pdVar6;
    }
  }
  if (uVar1 != 0) {
    pdVar6 = (this->dx_).ptr_to_data;
    pFVar3 = (fadexpr->fadexpr_).left_;
    pFVar4 = (((pFVar3->fadexpr_).left_)->fadexpr_).expr_;
    if ((pFVar4->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] =
               (-pFVar4->defaultVal * (pFVar3->fadexpr_).right_.constant_) /
               (fadexpr->fadexpr_).right_.constant_;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar5 = (pFVar4->dx_).ptr_to_data;
      uVar7 = 0;
      do {
        pdVar6[uVar7] =
             (-pdVar5[uVar7] * (pFVar3->fadexpr_).right_.constant_) /
             (fadexpr->fadexpr_).right_.constant_;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  this->val_ = (-((((pFVar3->fadexpr_).left_)->fadexpr_).expr_)->val_ *
               (pFVar3->fadexpr_).right_.constant_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}